

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseAssembler::embedLabel(BaseAssembler *this,Label *label,size_t dataSize)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  Error EVar4;
  LabelEntry **ppLVar5;
  LabelLink *pLVar6;
  Section *in_RDX;
  long in_RSI;
  BaseAssembler *in_RDI;
  LabelLink *link;
  OffsetFormat of;
  Error err;
  StringTmp<256UL> sb;
  char *in_stack_000000d0;
  int in_stack_000000dc;
  char *in_stack_000000e0;
  Error _err;
  CodeWriter writer;
  LabelEntry *le;
  RelocEntry *re;
  StringTmp<256UL> *in_stack_fffffffffffffcd8;
  BaseEmitter *in_stack_fffffffffffffce0;
  ZoneVector<asmjit::v1_14::LabelEntry_*> *in_stack_fffffffffffffce8;
  BaseAssembler *in_stack_fffffffffffffcf0;
  ZoneVector<asmjit::v1_14::LabelEntry_*> *in_stack_fffffffffffffcf8;
  CodeHolder *in_stack_fffffffffffffd00;
  CodeHolder *in_stack_fffffffffffffd08;
  bool local_2e2;
  LabelEntry *local_2e0;
  Arch local_2b0;
  ZoneVector<asmjit::v1_14::LabelEntry_*> aZStack_2af [3];
  uint32_t in_stack_fffffffffffffd54;
  BaseEmitter *in_stack_fffffffffffffd58;
  FormatFlags in_stack_fffffffffffffd64;
  ZoneVector<asmjit::v1_14::LabelEntry_*> *in_stack_fffffffffffffd68;
  CodeWriter local_180;
  LabelEntry *local_178;
  uint32_t *local_170;
  Section *local_168;
  long local_160;
  Error local_14c;
  Section *local_138;
  Section *local_130;
  Section *local_128;
  Logger *local_120;
  undefined1 local_109;
  Arch *local_108;
  undefined1 local_f9;
  Arch *local_f8;
  undefined1 local_e9;
  Arch *local_e8;
  BaseAssembler *local_e0;
  CodeHolder *local_d8;
  CodeHolder *local_c0;
  Section *local_b8;
  CodeHolder *local_b0;
  long local_a0;
  LabelEntry *local_98;
  LabelEntry *local_90;
  LabelEntry *local_88;
  uint32_t *local_80;
  FormatOptions *local_78;
  Environment *local_60;
  BaseAssembler *local_58;
  BaseAssembler *local_50;
  BaseAssembler *local_48;
  BaseAssembler *local_40;
  Environment *local_38;
  Arch local_2e;
  Arch local_2d;
  uint local_2c;
  CodeHolder *local_28;
  uint local_1c;
  CodeHolder *local_18;
  ZoneVector<asmjit::v1_14::LabelEntry_*> *local_10;
  CodeHolder *local_8;
  
  if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    DebugUtils::errored(5);
    local_14c = BaseEmitter::reportError
                          (&in_stack_fffffffffffffcf0->super_BaseEmitter,
                           (Error)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                           (char *)in_stack_fffffffffffffce0);
  }
  else {
    if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
      DebugUtils::assertionFailed(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
    }
    local_c0 = (in_RDI->super_BaseEmitter)._code;
    local_2c = *(uint *)(in_RSI + 4);
    local_10 = &local_c0->_labelEntries;
    local_168 = in_RDX;
    local_160 = in_RSI;
    local_28 = local_c0;
    local_1c = local_2c;
    local_18 = local_c0;
    if (local_2c < *(uint *)&local_c0->field_0x100) {
      ppLVar5 = ZoneVector<asmjit::v1_14::LabelEntry_*>::operator[]
                          (in_stack_fffffffffffffce8,(size_t)in_stack_fffffffffffffce0);
      local_2e0 = *ppLVar5;
    }
    else {
      local_2e0 = (LabelEntry *)0x0;
    }
    local_178 = local_2e0;
    if (local_2e0 == (LabelEntry *)0x0) {
      DebugUtils::errored(0xc);
      local_14c = BaseEmitter::reportError
                            (&in_stack_fffffffffffffcf0->super_BaseEmitter,
                             (Error)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             (char *)in_stack_fffffffffffffce0);
    }
    else {
      if (local_168 == (Section *)0x0) {
        local_38 = &(in_RDI->super_BaseEmitter)._environment;
        local_2e = local_38->_arch;
        uVar3 = 8;
        if ((local_2e & k32BitMask) == k32BitMask) {
          uVar3 = 4;
        }
        local_168 = (Section *)(ulong)uVar3;
        local_2d = local_2e;
      }
      local_b8 = local_168;
      local_2e2 = (local_168 == (Section *)0x0 ||
                  ((ulong)local_168 & (ulong)&local_168[-1]._buffer.field_0x1f) != 0) ||
                  (Section *)0x8 < local_168;
      if (local_2e2) {
        DebugUtils::errored(0x33);
        local_14c = BaseEmitter::reportError
                              (&in_stack_fffffffffffffcf0->super_BaseEmitter,
                               (Error)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                               (char *)in_stack_fffffffffffffce0);
      }
      else {
        CodeWriter::CodeWriter(&local_180,in_RDI);
        local_14c = CodeWriter::ensureSpace
                              ((CodeWriter *)in_stack_fffffffffffffd08,
                               (BaseAssembler *)in_stack_fffffffffffffd00,
                               (size_t)in_stack_fffffffffffffcf8);
        if (local_14c == 0) {
          if ((in_RDI->super_BaseEmitter)._logger != (Logger *)0x0) {
            in_stack_fffffffffffffd00 = (CodeHolder *)&local_2b0;
            local_b0 = in_stack_fffffffffffffd00;
            local_8 = in_stack_fffffffffffffd00;
            memset(in_stack_fffffffffffffd00,0,0x20);
            StringTmp<256UL>::_resetToTemporary((StringTmp<256UL> *)in_stack_fffffffffffffd00);
            local_e8 = &local_2b0;
            local_e9 = 0x2e;
            String::_opChar((String *)in_stack_fffffffffffffce8,
                            (ModifyOp)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                            (char)((ulong)in_stack_fffffffffffffce0 >> 0x18));
            local_120 = (in_RDI->super_BaseEmitter)._logger;
            local_78 = &local_120->_options;
            local_60 = &(in_RDI->super_BaseEmitter)._environment;
            Formatter::formatDataType
                      ((String *)in_stack_fffffffffffffce8,
                       (FormatFlags)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                       (Arch)((ulong)in_stack_fffffffffffffce0 >> 0x18),
                       (TypeId)((ulong)in_stack_fffffffffffffce0 >> 0x10));
            local_f8 = &local_2b0;
            local_f9 = 0x20;
            String::_opChar((String *)in_stack_fffffffffffffce8,
                            (ModifyOp)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                            (char)((ulong)in_stack_fffffffffffffce0 >> 0x18));
            local_a0 = local_160;
            Formatter::formatLabel
                      ((String *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                       in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
            local_108 = &local_2b0;
            local_109 = 10;
            uVar2 = (ulong)in_stack_fffffffffffffce0 >> 0x20;
            uVar1 = (ulong)in_stack_fffffffffffffce0 >> 0x18;
            in_stack_fffffffffffffce0 = in_stack_fffffffffffffd58;
            String::_opChar((String *)in_stack_fffffffffffffce8,(ModifyOp)uVar2,(char)uVar1);
            in_stack_fffffffffffffd08 = (CodeHolder *)(in_RDI->super_BaseEmitter)._logger;
            in_stack_fffffffffffffcf0 = (BaseAssembler *)&local_2b0;
            in_stack_fffffffffffffce8 = in_stack_fffffffffffffd68;
            if (local_2b0 < (kMIPS64_BE|kMIPS32_BE)) {
              in_stack_fffffffffffffce0 = (BaseEmitter *)(ulong)local_2b0;
              in_stack_fffffffffffffce8 = aZStack_2af;
            }
            in_stack_fffffffffffffcf8 = in_stack_fffffffffffffce8;
            local_e0 = in_stack_fffffffffffffcf0;
            local_d8 = in_stack_fffffffffffffd08;
            local_58 = in_stack_fffffffffffffcf0;
            local_50 = in_stack_fffffffffffffcf0;
            local_48 = in_stack_fffffffffffffcf0;
            local_40 = in_stack_fffffffffffffcf0;
            (**(_func_int **)((long)in_stack_fffffffffffffd08->_environment + 0x10))
                      (in_stack_fffffffffffffd08,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0
                      );
            StringTmp<256UL>::~StringTmp(in_stack_fffffffffffffcd8);
          }
          EVar4 = CodeHolder::newRelocEntry
                            (in_stack_fffffffffffffd00,(RelocEntry **)in_stack_fffffffffffffcf8,
                             (RelocType)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
          if (EVar4 == 0) {
            local_128 = in_RDI->_section;
            local_170[4] = local_128->_id;
            *(long *)(local_170 + 6) = (long)in_RDI->_bufferPtr - (long)in_RDI->_bufferData;
            OffsetFormat::resetToSimpleValue
                      ((OffsetFormat *)in_stack_fffffffffffffcf0,
                       (OffsetType)((ulong)in_stack_fffffffffffffce8 >> 0x38),
                       (size_t)in_stack_fffffffffffffce0);
            local_98 = local_178;
            if (local_178->_section == (Section *)0x0) {
              OffsetFormat::resetToSimpleValue
                        ((OffsetFormat *)in_stack_fffffffffffffcf0,
                         (OffsetType)((ulong)in_stack_fffffffffffffce8 >> 0x38),
                         (size_t)in_stack_fffffffffffffce0);
              local_138 = in_RDI->_section;
              pLVar6 = CodeHolder::newLabelLink
                                 (in_stack_fffffffffffffd08,(LabelEntry *)in_stack_fffffffffffffd00,
                                  (uint32_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                  (size_t)in_stack_fffffffffffffcf0,
                                  (intptr_t)in_stack_fffffffffffffce8,
                                  (OffsetFormat *)in_stack_fffffffffffffce0);
              EVar4 = (Error)((ulong)in_stack_fffffffffffffce8 >> 0x20);
              if (pLVar6 == (LabelLink *)0x0) {
                DebugUtils::errored(1);
                EVar4 = BaseEmitter::reportError
                                  (&in_stack_fffffffffffffcf0->super_BaseEmitter,EVar4,
                                   (char *)in_stack_fffffffffffffce0);
                return EVar4;
              }
              local_80 = local_170;
              pLVar6->relocId = *local_170;
            }
            else {
              local_90 = local_178;
              local_130 = local_178->_section;
              local_170[5] = local_130->_id;
              local_88 = local_178;
              *(uint64_t *)(local_170 + 8) = local_178->_offset;
            }
            CodeWriter::emitZeros
                      ((CodeWriter *)in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
            CodeWriter::done((CodeWriter *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
            local_14c = 0;
          }
          else {
            local_14c = BaseEmitter::reportError
                                  (&in_stack_fffffffffffffcf0->super_BaseEmitter,
                                   (Error)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                                   (char *)in_stack_fffffffffffffce0);
          }
        }
      }
    }
  }
  return local_14c;
}

Assistant:

Error BaseAssembler::embedLabel(const Label& label, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  ASMJIT_ASSERT(_code != nullptr);
  RelocEntry* re;
  LabelEntry* le = _code->labelEntry(label);

  if (ASMJIT_UNLIKELY(!le))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  if (dataSize == 0)
    dataSize = registerSize();

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(dataSize) || dataSize > 8))
    return reportError(DebugUtils::errored(kErrorInvalidOperandSize));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<256> sb;
    sb.append('.');
    Formatter::formatDataType(sb, _logger->flags(), arch(), dataTypeIdBySize[dataSize]);
    sb.append(' ');
    Formatter::formatLabel(sb, FormatFlags::kNone, this, label.id());
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  Error err = _code->newRelocEntry(&re, RelocType::kRelToAbs);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  re->_sourceSectionId = _section->id();
  re->_sourceOffset = offset();
  re->_format.resetToSimpleValue(OffsetType::kUnsignedOffset, dataSize);

  if (le->isBound()) {
    re->_targetSectionId = le->section()->id();
    re->_payload = le->offset();
  }
  else {
    OffsetFormat of;
    of.resetToSimpleValue(OffsetType::kUnsignedOffset, dataSize);

    LabelLink* link = _code->newLabelLink(le, _section->id(), offset(), 0, of);
    if (ASMJIT_UNLIKELY(!link))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));

    link->relocId = re->id();
  }

  // Emit dummy DWORD/QWORD depending on the data size.
  writer.emitZeros(dataSize);
  writer.done(this);

  return kErrorOk;
}